

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

int mriStep_CheckCoupling(ARKodeMem ark_mem)

{
  void *pvVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  MRIStepCoupling MRIC;
  char *msgfmt;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  double dVar15;
  
  pvVar1 = ark_mem->step_mem;
  if (pvVar1 == (void *)0x0) {
    msgfmt = "Time step module memory is NULL.";
    iVar6 = -0x15;
    iVar4 = -0x15;
    goto LAB_00412fa8;
  }
  piVar2 = *(int **)((long)pvVar1 + 0x38);
  uVar5 = piVar2[1];
  uVar9 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    msgfmt = "stages < 1!";
  }
  else if (piVar2[2] < 1) {
    msgfmt = "method order < 1";
  }
  else {
    if ((0 < piVar2[3]) || (ark_mem->fixedstep != 0)) {
      if ((*(int *)((long)pvVar1 + 0x1c) == 0) || (*(int *)((long)pvVar1 + 0x18) == 0)) {
        if (*(int *)((long)pvVar1 + 0x18) == 0) {
          if ((*(long *)(piVar2 + 6) == 0) && (*(long *)(piVar2 + 8) != 0)) goto LAB_00412fdb;
          msgfmt = "Invalid coupling table fro an implicit problem!";
        }
        else {
          if ((*(long *)(piVar2 + 6) != 0) && (*(long *)(piVar2 + 8) == 0)) {
LAB_00412fdb:
            if ((*(long *)(piVar2 + 6) != 0) && (0 < (long)*piVar2)) {
              uVar7 = 1;
              if (1 < (int)uVar5) {
                uVar7 = (ulong)uVar5;
              }
              dVar15 = 0.0;
              lVar8 = 0;
              do {
                uVar11 = 0;
                do {
                  uVar13 = uVar11;
                  do {
                    dVar15 = dVar15 + ABS(*(double *)
                                           (*(long *)(*(long *)(*(long *)(piVar2 + 6) + lVar8 * 8) +
                                                     uVar11 * 8) + uVar13 * 8));
                    uVar13 = uVar13 + 1;
                  } while (uVar13 < uVar9);
                  uVar11 = uVar11 + 1;
                } while (uVar11 != uVar7);
                lVar8 = lVar8 + 1;
              } while (lVar8 != *piVar2);
              if (2.220446049250313e-14 < dVar15) {
                msgfmt = "Coupling can be up to ERK (at most)!";
                goto LAB_00412f44;
              }
            }
            if ((*(long *)(piVar2 + 8) != 0) && (0 < (long)*piVar2)) {
              uVar7 = 1;
              if (1 < (int)uVar5) {
                uVar7 = (ulong)uVar5;
              }
              dVar15 = 0.0;
              lVar8 = 0;
              do {
                lVar10 = 0;
                uVar11 = uVar9;
                uVar13 = 0;
                do {
                  uVar12 = uVar13 + 1;
                  if (uVar12 < uVar9) {
                    uVar14 = 1;
                    do {
                      dVar15 = dVar15 + ABS(*(double *)
                                             (*(long *)(*(long *)(*(long *)(piVar2 + 8) + lVar8 * 8)
                                                       + uVar13 * 8) + lVar10 + uVar14 * 8));
                      uVar14 = uVar14 + 1;
                    } while (uVar11 != uVar14);
                  }
                  lVar10 = lVar10 + 8;
                  uVar11 = uVar11 - 1;
                  uVar13 = uVar12;
                } while (uVar12 != uVar7);
                lVar8 = lVar8 + 1;
              } while (lVar8 != *piVar2);
              if (2.220446049250313e-14 < dVar15) {
                msgfmt = "Coupling can be up to DIRK (at most)!";
                goto LAB_00412f44;
              }
            }
            MRIC = *(MRIStepCoupling *)((long)pvVar1 + 0x38);
            uVar5 = MRIC->stages;
            bVar3 = false;
            if (0 < (int)uVar5) {
              bVar3 = true;
              iVar6 = 0;
              do {
                iVar4 = mriStepCoupling_GetStageType(MRIC,iVar6);
                if (iVar4 == 3) {
                  bVar3 = false;
                }
                iVar6 = iVar6 + 1;
                MRIC = *(MRIStepCoupling *)((long)pvVar1 + 0x38);
                uVar5 = MRIC->stages;
              } while (iVar6 < (int)uVar5);
              bVar3 = !bVar3;
            }
            if (bVar3) {
              msgfmt = "solve-coupled DIRK stages not currently supported";
            }
            else {
              if (1 < (int)uVar5) {
                bVar3 = true;
                uVar9 = 1;
                do {
                  if (MRIC->c[uVar9] - MRIC->c[uVar9 - 1] < -2.220446049250313e-14) {
                    bVar3 = false;
                  }
                  uVar9 = uVar9 + 1;
                } while (uVar5 != uVar9);
                if (!bVar3) {
                  msgfmt = "Stage times must be sorted.";
                  goto LAB_00412f44;
                }
              }
              dVar15 = ABS(*MRIC->c);
              if (0 < (long)MRIC->nmat) {
                lVar8 = 0;
                do {
                  if (0 < (int)uVar5) {
                    uVar9 = 0;
                    do {
                      if (MRIC->W != (realtype ***)0x0) {
                        dVar15 = dVar15 + ABS((*MRIC->W[lVar8])[uVar9]);
                      }
                      if (MRIC->G != (realtype ***)0x0) {
                        dVar15 = dVar15 + ABS((*MRIC->G[lVar8])[uVar9]);
                      }
                      uVar9 = uVar9 + 1;
                    } while (uVar5 != uVar9);
                  }
                  lVar8 = lVar8 + 1;
                } while (lVar8 != MRIC->nmat);
              }
              if (dVar15 <= 2.220446049250313e-14) {
                if (ABS(1.0 - MRIC->c[(long)(int)uVar5 + -1]) <= 2.220446049250313e-14) {
                  return 0;
                }
                msgfmt = "Final stage time must be equal 1.";
              }
              else {
                msgfmt = "First stage must equal old solution.";
              }
            }
            goto LAB_00412f44;
          }
          msgfmt = "Invalid coupling table for an explicit problem!";
        }
      }
      else {
        if ((*(long *)(piVar2 + 6) != 0) && (*(long *)(piVar2 + 8) != 0)) goto LAB_00412fdb;
        msgfmt = "Invalid coupling table for an IMEX problem!";
      }
      iVar6 = -0x16;
      iVar4 = -0x16;
      goto LAB_00412fa8;
    }
    msgfmt = "embedding order < 1";
  }
LAB_00412f44:
  iVar6 = -0x29;
  iVar4 = -0x29;
LAB_00412fa8:
  arkProcessError(ark_mem,iVar4,"ARKode::MRIStep","mriStep_CheckCoupling",msgfmt);
  return iVar6;
}

Assistant:

int mriStep_CheckCoupling(ARKodeMem ark_mem)
{
  int i, j, k;
  booleantype okay;
  ARKodeMRIStepMem step_mem;
  realtype Gabs, Wabs;
  const realtype tol = RCONST(100.0)*UNIT_ROUNDOFF;

  /* access ARKodeMRIStepMem structure */
  if (ark_mem->step_mem==NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::MRIStep",
                    "mriStep_CheckCoupling", MSG_MRISTEP_NO_MEM);
    return(ARK_MEM_NULL);
  }
  step_mem = (ARKodeMRIStepMem) ark_mem->step_mem;

  /* check that stages > 0 */
  if (step_mem->MRIC->stages < 1) {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, "ARKode::MRIStep",
                    "mriStep_CheckCoupling", "stages < 1!");
    return(ARK_INVALID_TABLE);
  }

  /* check that method order q > 0 */
  if (step_mem->MRIC->q < 1) {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, "ARKode::MRIStep",
                    "mriStep_CheckCoupling", "method order < 1");
    return(ARK_INVALID_TABLE);
  }

  /* check that embedding order p > 0 (if adaptive) */
  if ((step_mem->MRIC->p < 1) && (!ark_mem->fixedstep)) {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, "ARKode::MRIStep",
                    "mriStep_CheckCoupling", "embedding order < 1");
    return(ARK_INVALID_TABLE);
  }

  /* Check that the matrices are defined appropriately */
  if (step_mem->implicit_rhs && step_mem->explicit_rhs) {
    /* ImEx */
    if (!(step_mem->MRIC->W) || !(step_mem->MRIC->G)) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep",
                      "mriStep_CheckCoupling",
                      "Invalid coupling table for an IMEX problem!");
      return(ARK_ILL_INPUT);
    }
  } else if (step_mem->explicit_rhs) {
    /* Explicit */
    if (!(step_mem->MRIC->W) || step_mem->MRIC->G) {
      arkProcessError(ark_mem,ARK_ILL_INPUT, "ARKode::MRIStep",
                      "mriStep_CheckCoupling",
                      "Invalid coupling table for an explicit problem!");
      return(ARK_ILL_INPUT);
    }
  } else {
    /* Implicit */
    if (step_mem->MRIC->W || !(step_mem->MRIC->G)) {
      arkProcessError(ark_mem,ARK_ILL_INPUT, "ARKode::MRIStep",
                      "mriStep_CheckCoupling",
                      "Invalid coupling table fro an implicit problem!");
      return(ARK_ILL_INPUT);
    }
  }

  /* Check that W tables are strictly lower triangular */
  if (step_mem->MRIC->W) {
    Wabs = RCONST(0.0);
    for (k=0; k<step_mem->MRIC->nmat; k++)
      for (i=0; i<step_mem->MRIC->stages; i++)
        for (j=i; j<step_mem->MRIC->stages; j++)
          Wabs += SUNRabs(step_mem->MRIC->W[k][i][j]);
    if (Wabs > tol) {
      arkProcessError(ark_mem, ARK_INVALID_TABLE, "ARKode::MRIStep",
                      "mriStep_CheckCoupling",
                      "Coupling can be up to ERK (at most)!");
      return(ARK_INVALID_TABLE);
    }
  }

  /* Check that G tables are lower triangular */
  if (step_mem->MRIC->G) {
    Gabs = RCONST(0.0);
    for (k=0; k<step_mem->MRIC->nmat; k++)
      for (i=0; i<step_mem->MRIC->stages; i++)
        for (j=i+1; j<step_mem->MRIC->stages; j++)
          Gabs += SUNRabs(step_mem->MRIC->G[k][i][j]);
    if (Gabs > tol) {
      arkProcessError(ark_mem, ARK_INVALID_TABLE, "ARKode::MRIStep",
                      "mriStep_CheckCoupling",
                      "Coupling can be up to DIRK (at most)!");
      return(ARK_INVALID_TABLE);
    }
  }

  /* Check that no stage has MRISTAGE_DIRK_FAST type (for now) */
  okay = SUNTRUE;
  for (i=0; i<step_mem->MRIC->stages; i++)
    if (mriStepCoupling_GetStageType(step_mem->MRIC, i) == MRISTAGE_DIRK_FAST)
      okay = SUNFALSE;
  if (!okay) {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, "ARKode::MRIStep",
                    "mriStep_CheckCoupling",
                    "solve-coupled DIRK stages not currently supported");
    return(ARK_INVALID_TABLE);
  }

  /* check that stage times are sorted */
  okay = SUNTRUE;
  for (i=1; i<step_mem->MRIC->stages; i++) {
    if ((step_mem->MRIC->c[i] - step_mem->MRIC->c[i-1]) < -tol)
      okay = SUNFALSE;
  }
  if (!okay) {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, "ARKode::MRIStep",
                    "mriStep_CheckCoupling",
                    "Stage times must be sorted.");
    return(ARK_INVALID_TABLE);
  }

  /* check that the first stage is just the old step solution */
  Gabs = SUNRabs(step_mem->MRIC->c[0]);
  for (k=0; k<step_mem->MRIC->nmat; k++)
    for (j=0; j<step_mem->MRIC->stages; j++) {
      if (step_mem->MRIC->W)
        Gabs += SUNRabs(step_mem->MRIC->W[k][0][j]);
      if (step_mem->MRIC->G)
        Gabs += SUNRabs(step_mem->MRIC->G[k][0][j]);
    }
  if (Gabs > tol) {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, "ARKode::MRIStep",
                    "mriStep_CheckCoupling",
                    "First stage must equal old solution.");
    return(ARK_INVALID_TABLE);
  }

  /* check that the last stage is at the final time */
  if (SUNRabs(ONE - step_mem->MRIC->c[step_mem->MRIC->stages-1]) > tol) {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, "ARKode::MRIStep",
                    "mriStep_CheckCoupling",
                    "Final stage time must be equal 1.");
    return(ARK_INVALID_TABLE);
  }

  return(ARK_SUCCESS);
}